

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

void __thiscall
fmt::internal::PrintfFormatter<wchar_t>::format
          (PrintfFormatter<wchar_t> *this,long writer,wchar_t *param_3)

{
  undefined8 *puVar1;
  wchar_t *pwVar2;
  bool bVar3;
  wchar_t wVar4;
  uint uVar5;
  FormatError *this_00;
  size_t sVar6;
  Arg *arg_00;
  Arg *arg_01;
  long lVar7;
  wchar_t *str;
  wchar_t *pwVar8;
  wchar_t *pwVar9;
  ulong uVar10;
  Arg arg;
  wchar_t *local_90;
  FormatSpec local_88;
  Arg *local_70;
  long local_68;
  FormatSpec *local_60;
  Arg local_58;
  
  wVar4 = *param_3;
  if (wVar4 != L'\0') {
    pwVar9 = param_3;
    local_70 = (Arg *)this;
    do {
      local_90 = pwVar9 + 1;
      if (wVar4 == L'%') {
        if (*local_90 == L'%') {
          if (param_3 != local_90) {
            sVar6 = (long)local_90 - (long)param_3;
            puVar1 = *(undefined8 **)(writer + 8);
            lVar7 = puVar1[2];
            uVar10 = ((long)sVar6 >> 2) + lVar7;
            if ((ulong)puVar1[3] < uVar10) {
              (**(code **)*puVar1)(puVar1,uVar10);
              lVar7 = puVar1[2];
            }
            memmove((void *)(lVar7 * 4 + puVar1[1]),param_3,sVar6);
            puVar1[2] = uVar10;
          }
          param_3 = local_90 + 1;
          local_90 = param_3;
        }
        else {
          if (param_3 != pwVar9) {
            puVar1 = *(undefined8 **)(writer + 8);
            lVar7 = puVar1[2];
            uVar10 = ((long)pwVar9 - (long)param_3 >> 2) + lVar7;
            if ((ulong)puVar1[3] < uVar10) {
              (**(code **)*puVar1)(puVar1,uVar10);
              lVar7 = puVar1[2];
            }
            memmove((void *)(lVar7 * 4 + puVar1[1]),param_3,(long)pwVar9 - (long)param_3);
            puVar1[2] = uVar10;
          }
          arg_01 = local_70;
          local_88.super_AlignSpec.super_WidthSpec.width_ = 0;
          local_88.super_AlignSpec.super_WidthSpec.fill_ = L' ';
          local_88.super_AlignSpec.align_ = ALIGN_RIGHT;
          local_88.flags_ = 0;
          local_88.precision_ = 0xffffffff;
          local_88.type_ = '\0';
          uVar5 = parse_header((PrintfFormatter<wchar_t> *)local_70,&local_90,&local_88);
          pwVar9 = local_90;
          if (*local_90 == L'.') {
            if ((uint)(local_90[1] + L'\xffffffd0') < 10) {
              local_90 = local_90 + 1;
              local_88.precision_ = parse_nonnegative_int<wchar_t>(&local_90);
              pwVar9 = local_90;
            }
            else {
              pwVar9 = local_90 + 1;
              if (local_90[1] == L'*') {
                local_90 = local_90 + 2;
                arg_00 = arg_01;
                get_arg(&local_58,(PrintfFormatter<wchar_t> *)arg_01,local_90,0xffffffff);
                local_88.precision_ =
                     ArgVisitor<fmt::(anonymous_namespace)::PrecisionHandler,_int>::visit
                               ((ArgVisitor<fmt::(anonymous_namespace)::PrecisionHandler,_int> *)
                                &local_58,arg_00);
                pwVar9 = local_90;
              }
            }
          }
          local_90 = pwVar9;
          get_arg(&local_58,(PrintfFormatter<wchar_t> *)arg_01,local_90,uVar5);
          uVar5 = local_88.flags_;
          if (((local_88._8_8_ & 0x800000000) != 0) &&
             (bVar3 = ArgVisitor<fmt::(anonymous_namespace)::IsZeroInt,_bool>::visit
                                ((ArgVisitor<fmt::(anonymous_namespace)::IsZeroInt,_bool> *)
                                 &local_58,arg_01), bVar3)) {
            local_88._8_8_ = CONCAT44(uVar5,local_88.super_AlignSpec.align_) & 0xfffffff7ffffffff;
          }
          pwVar9 = local_90;
          if (local_88.super_AlignSpec.super_WidthSpec.fill_ == L'0') {
            if ((int)local_58.type < 10) {
              local_88.super_AlignSpec.align_ = 4;
            }
            else {
              local_88.super_AlignSpec.super_WidthSpec.fill_ = L' ';
            }
          }
          pwVar8 = local_90 + 1;
          wVar4 = *local_90;
          if (wVar4 < L'l') {
            pwVar2 = pwVar8;
            if (wVar4 != L'L') {
              if (wVar4 == L'h') {
                if (*pwVar8 == L'h') {
                  pwVar8 = local_90 + 2;
                  pwVar9 = local_90 + 2;
                  local_90 = pwVar8;
                  ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<signed_char>,_void>::visit
                            ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<signed_char>,_void>
                              *)&local_58,(Arg *)(ulong)(uint)*pwVar9);
                  pwVar2 = local_90;
                }
                else {
                  local_90 = pwVar8;
                  ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<short>,_void>::visit
                            ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<short>,_void> *)
                             &local_58,(Arg *)(ulong)(uint)*pwVar8);
                  pwVar2 = local_90;
                }
              }
              else {
                if (wVar4 == L'j') goto LAB_00134388;
LAB_001343f9:
                ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<void>,_void>::visit
                          ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<void>,_void> *)
                           &local_58,(Arg *)(ulong)(uint)wVar4);
                pwVar8 = pwVar9;
                pwVar2 = local_90;
              }
            }
          }
          else if (wVar4 == L'l') {
            wVar4 = *pwVar8;
            if (wVar4 != L'l') goto LAB_0013438b;
            pwVar8 = local_90 + 2;
            pwVar9 = local_90 + 2;
            local_90 = pwVar8;
            ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long_long>,_void>::visit
                      ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long_long>,_void> *)
                       &local_58,(Arg *)(ulong)(uint)*pwVar9);
            pwVar2 = local_90;
          }
          else if (wVar4 == L't') {
LAB_00134388:
            wVar4 = *pwVar8;
LAB_0013438b:
            local_90 = pwVar8;
            ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void>::visit
                      ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void> *)&local_58
                       ,(Arg *)(ulong)(uint)wVar4);
            pwVar2 = local_90;
          }
          else {
            if (wVar4 != L'z') goto LAB_001343f9;
            local_90 = pwVar8;
            ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<unsigned_long>,_void>::visit
                      ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<unsigned_long>,_void> *)
                       &local_58,(Arg *)(ulong)(uint)*pwVar8);
            pwVar2 = local_90;
          }
          local_90 = pwVar2;
          if (*pwVar8 == L'\0') {
            this_00 = (FormatError *)__cxa_allocate_exception(0x10);
            FormatError::FormatError(this_00,(CStringRef)0x13a1e4);
            __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
          }
          param_3 = pwVar8 + 1;
          local_88.type_ = (char)*pwVar8;
          local_90 = param_3;
          if ((int)local_58.type < 8) {
            if (local_88.type_ == 'c') {
              ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void>::visit
                        ((ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *)&local_58,
                         &local_58);
            }
            else if ((local_88.type_ == 'u') || (local_88.type_ == 'i')) {
              local_88.type_ = 'd';
            }
          }
          local_60 = &local_88;
          local_68 = writer;
          ArgVisitor<fmt::internal::PrintfArgFormatter<wchar_t>,_void>::visit
                    ((ArgVisitor<fmt::internal::PrintfArgFormatter<wchar_t>,_void> *)&local_68,
                     &local_58);
        }
      }
      wVar4 = *local_90;
      pwVar9 = local_90;
    } while (wVar4 != L'\0');
    if (param_3 != local_90) {
      sVar6 = (long)local_90 - (long)param_3;
      puVar1 = *(undefined8 **)(writer + 8);
      lVar7 = puVar1[2];
      uVar10 = ((long)sVar6 >> 2) + lVar7;
      if ((ulong)puVar1[3] < uVar10) {
        (**(code **)*puVar1)(puVar1,uVar10);
        lVar7 = puVar1[2];
      }
      memmove((void *)(lVar7 * 4 + puVar1[1]),param_3,sVar6);
      puVar1[2] = uVar10;
    }
  }
  return;
}

Assistant:

void fmt::internal::PrintfFormatter<Char>::format(
    BasicWriter<Char> &writer, BasicCStringRef<Char> format_str) {
  const Char *start = format_str.c_str();
  const Char *s = start;
  while (*s) {
    Char c = *s++;
    if (c != '%') continue;
    if (*s == c) {
      write(writer, start, s);
      start = ++s;
      continue;
    }
    write(writer, start, s - 1);

    FormatSpec spec;
    spec.align_ = ALIGN_RIGHT;

    // Parse argument index, flags and width.
    unsigned arg_index = parse_header(s, spec);

    // Parse precision.
    if (*s == '.') {
      ++s;
      if ('0' <= *s && *s <= '9') {
        spec.precision_ = static_cast<int>(parse_nonnegative_int(s));
      } else if (*s == '*') {
        ++s;
        spec.precision_ = fmt::PrecisionHandler().visit(get_arg(s));
      }
    }

    Arg arg = get_arg(s, arg_index);
    if (spec.flag(HASH_FLAG) && fmt::IsZeroInt().visit(arg))
      spec.flags_ &= ~to_unsigned<int>(HASH_FLAG);
    if (spec.fill_ == '0') {
      if (arg.type <= Arg::LAST_NUMERIC_TYPE)
        spec.align_ = ALIGN_NUMERIC;
      else
        spec.fill_ = ' ';  // Ignore '0' flag for non-numeric types.
    }

    // Parse length and convert the argument to the required type.
    switch (*s++) {
    case 'h':
      if (*s == 'h')
        fmt::ArgConverter<signed char>(arg, *++s).visit(arg);
      else
        fmt::ArgConverter<short>(arg, *s).visit(arg);
      break;
    case 'l':
      if (*s == 'l')
        fmt::ArgConverter<fmt::LongLong>(arg, *++s).visit(arg);
      else
        fmt::ArgConverter<long>(arg, *s).visit(arg);
      break;
    case 'j':
      fmt::ArgConverter<intmax_t>(arg, *s).visit(arg);
      break;
    case 'z':
      fmt::ArgConverter<std::size_t>(arg, *s).visit(arg);
      break;
    case 't':
      fmt::ArgConverter<std::ptrdiff_t>(arg, *s).visit(arg);
      break;
    case 'L':
      // printf produces garbage when 'L' is omitted for long double, no
      // need to do the same.
      break;
    default:
      --s;
      fmt::ArgConverter<void>(arg, *s).visit(arg);
    }

    // Parse type.
    if (!*s)
      FMT_THROW(FormatError("invalid format string"));
    spec.type_ = static_cast<char>(*s++);
    if (arg.type <= Arg::LAST_INTEGER_TYPE) {
      // Normalize type.
      switch (spec.type_) {
      case 'i': case 'u':
        spec.type_ = 'd';
        break;
      case 'c':
        // TODO: handle wchar_t
        fmt::CharConverter(arg).visit(arg);
        break;
      }
    }

    start = s;

    // Format argument.
    internal::PrintfArgFormatter<Char>(writer, spec).visit(arg);
  }
  write(writer, start, s);
}